

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

VkResult __thiscall
Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
          (VulkanDevice *this,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  pointer *pppVVar1;
  iterator __position;
  VkResult VVar2;
  VkStructureType *pVVar3;
  VkSamplerYcbcrConversion conv;
  VkSamplerYcbcrConversionCreateInfo ycbcr;
  VkSamplerYcbcrConversion_T *local_90;
  VkSamplerCreateInfo *local_88;
  VkSampler *local_80;
  VkSamplerYcbcrConversionCreateInfo local_78;
  
  local_90 = (VkSamplerYcbcrConversion_T *)0x0;
  pVVar3 = (VkStructureType *)create_info->pNext;
  local_88 = create_info;
  local_80 = sampler;
  if (pVVar3 != (VkStructureType *)0x0) {
    do {
      if (*pVVar3 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
        local_78.sType = *pVVar3;
        local_78._4_4_ = pVVar3[1];
        local_78.format = pVVar3[4];
        local_78.ycbcrModel = pVVar3[5];
        local_78.ycbcrRange = pVVar3[6];
        local_78.components.r = pVVar3[7];
        local_78.components.g = pVVar3[8];
        local_78.components.b = pVVar3[9];
        local_78.components.a = pVVar3[10];
        local_78.xChromaOffset = pVVar3[0xb];
        local_78.yChromaOffset = pVVar3[0xc];
        local_78.chromaFilter = pVVar3[0xd];
        local_78.forceExplicitReconstruction = pVVar3[0xe];
        local_78._60_4_ = pVVar3[0xf];
        local_78.pNext = (void *)0x0;
        VVar2 = (*vkCreateSamplerYcbcrConversionKHR)
                          (this->device,&local_78,(VkAllocationCallbacks *)0x0,&local_90);
        if (VVar2 != VK_SUCCESS) {
          return VVar2;
        }
        __position._M_current =
             (this->ycbcr_conversions).
             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->ycbcr_conversions).
            super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSamplerYcbcrConversion_T*,std::allocator<VkSamplerYcbcrConversion_T*>>::
          _M_realloc_insert<VkSamplerYcbcrConversion_T*const&>
                    ((vector<VkSamplerYcbcrConversion_T*,std::allocator<VkSamplerYcbcrConversion_T*>>
                      *)&this->ycbcr_conversions,__position,&local_90);
        }
        else {
          *__position._M_current = local_90;
          pppVVar1 = &(this->ycbcr_conversions).
                      super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
        *pVVar3 = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
        *(VkSamplerYcbcrConversion_T **)(pVVar3 + 4) = local_90;
      }
      pVVar3 = *(VkStructureType **)(pVVar3 + 2);
    } while (pVVar3 != (VkStructureType *)0x0);
  }
  VVar2 = (*vkCreateSampler)(this->device,local_88,(VkAllocationCallbacks *)0x0,local_80);
  return VVar2;
}

Assistant:

VkResult VulkanDevice::create_sampler_with_ycbcr_remap(const VkSamplerCreateInfo *create_info, VkSampler *sampler)
{
	VkSamplerYcbcrConversion conv = VK_NULL_HANDLE;
	VkResult vr;

	// Kinda hacky. Resolve Ycbcr sampler objects.
	// Replace the create info inline.
	const auto *next = static_cast<const VkBaseInStructure *>(create_info->pNext);
	while (next)
	{
		if (next->sType == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO)
		{
			auto ycbcr = *reinterpret_cast<const VkSamplerYcbcrConversionCreateInfo *>(next);
			ycbcr.pNext = nullptr;

			if ((vr = vkCreateSamplerYcbcrConversionKHR(device, &ycbcr, nullptr, &conv)) != VK_SUCCESS)
				return vr;

			ycbcr_conversions.push_back(conv);

			// Kinda icky, but we know the conversion info is smaller than the create info.
			// It's also safe to mutate the input structs we get from enqueue_create_sampler().
			auto *mut_next = const_cast<VkBaseInStructure *>(next);
			mut_next->sType = VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO;
			reinterpret_cast<VkSamplerYcbcrConversionInfo *>(mut_next)->conversion = conv;
		}

		next = static_cast<const VkBaseInStructure *>(next->pNext);
	}

	if ((vr = vkCreateSampler(device, create_info, nullptr, sampler)) != VK_SUCCESS)
		return vr;

	return VK_SUCCESS;
}